

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

void __thiscall Test::expect<bool>(Test *this,bool *exp,bool *got,string *file,int line)

{
  ostream *poVar1;
  
  this->nr_tests = this->nr_tests + 1;
  if (*exp == *got) {
    this->nr_passed_tests = this->nr_passed_tests + 1;
    return;
  }
  if (this->verbose == true) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"TEST Error @");
    poVar1 = std::operator<<(poVar1,(string *)file);
    poVar1 = std::operator<<(poVar1,":");
    std::ostream::operator<<(poVar1,line);
    poVar1 = std::operator<<((ostream *)&std::cerr,", expected ");
    std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    poVar1 = std::operator<<((ostream *)&std::cerr,", got ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  return;
}

Assistant:

void expect(const T &exp, const T &got, const std::string &file, int line) {
    ++nr_tests;
    if (exp == got) {
      ++nr_passed_tests;
      return;
    }
    if (verbose) {
      std::cerr << "TEST Error @" << file << ":" << line;
      std::cerr << ", expected " << exp;
      std::cerr << ", got " << got << std::endl;
    }
  }